

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsstyle.cpp
# Opt level: O0

int QWindowsStylePrivate::fixedPixelMetric(PixelMetric pm)

{
  PixelMetric pm_local;
  int local_4;
  
  switch(pm) {
  case PM_ButtonDefaultIndicator:
  case PM_ButtonShiftHorizontal:
  case PM_ButtonShiftVertical:
  case PM_MenuHMargin:
  case PM_MenuVMargin:
  case PM_ToolBarItemMargin:
    local_4 = 1;
    break;
  default:
    local_4 = -0x5c18;
    break;
  case PM_SliderLength:
    local_4 = 0xb;
    break;
  case PM_DockWidgetSeparatorExtent:
    local_4 = 4;
    break;
  case PM_DockWidgetFrameWidth:
  case PM_DockWidgetTitleBarButtonMargin:
    local_4 = 4;
    break;
  case PM_MenuBarPanelWidth:
  case PM_MenuBarVMargin:
  case PM_MenuBarHMargin:
    local_4 = 0;
    break;
  case PM_TabBarTabShiftHorizontal:
    local_4 = 0;
    break;
  case PM_TabBarTabShiftVertical:
    local_4 = 2;
    break;
  case PM_ToolBarHandleExtent:
    local_4 = 10;
    break;
  case PM_ToolBarItemSpacing:
    local_4 = 0;
    break;
  case PM_SmallIconSize:
    local_4 = 0x10;
    break;
  case PM_LargeIconSize:
    local_4 = 0x20;
    break;
  case PM_DockWidgetTitleMargin:
    local_4 = 2;
  }
  return local_4;
}

Assistant:

int QWindowsStylePrivate::fixedPixelMetric(QStyle::PixelMetric pm)
{
    switch (pm) {
    case QStyle::PM_ToolBarItemSpacing:
        return 0;
    case QStyle::PM_ButtonDefaultIndicator:
    case QStyle::PM_ButtonShiftHorizontal:
    case QStyle::PM_ButtonShiftVertical:
    case QStyle::PM_MenuHMargin:
    case QStyle::PM_MenuVMargin:
    case QStyle::PM_ToolBarItemMargin:
        return 1;
    case QStyle::PM_DockWidgetSeparatorExtent:
        return 4;
#if QT_CONFIG(tabbar)
    case QStyle::PM_TabBarTabShiftHorizontal:
        return 0;
    case QStyle::PM_TabBarTabShiftVertical:
        return 2;
#endif

#if QT_CONFIG(slider)
    case QStyle::PM_SliderLength:
        return 11;
#endif // QT_CONFIG(slider)

#if QT_CONFIG(menu)
    case QStyle::PM_MenuBarHMargin:
    case QStyle::PM_MenuBarVMargin:
    case QStyle::PM_MenuBarPanelWidth:
        return 0;
    case QStyle::PM_SmallIconSize:
        return 16;
    case QStyle::PM_LargeIconSize:
        return 32;
    case QStyle::PM_DockWidgetTitleMargin:
        return 2;
    case QStyle::PM_DockWidgetTitleBarButtonMargin:
    case QStyle::PM_DockWidgetFrameWidth:
        return 4;

#endif // QT_CONFIG(menu)
    case QStyle::PM_ToolBarHandleExtent:
        return 10;
    default:
        break;
    }
    return QWindowsStylePrivate::InvalidMetric;
}